

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Virtual_Machine.cpp
# Opt level: O3

void __thiscall
Virtual_Machine::Virtual_Machine
          (Virtual_Machine *this,RPN *prog_par,
          vector<ID_table_t,_std::allocator<ID_table_t>_> *ID_tables_vec_par)

{
  this->prog = prog_par;
  (this->cmd_ptr)._M_current =
       (prog_par->super_vector<Lex,_std::allocator<Lex>_>).
       super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.super__Vector_impl_data._M_start;
  Lex::Lex(&this->c_cmd);
  this->ID_tables_vec = ID_tables_vec_par;
  Lex::Lex(&this->c_lex,LEX_NULL,0,0);
  Lex::Lex(&this->arg1,LEX_NULL,0,0);
  Lex::Lex(&this->arg2,LEX_NULL,0,0);
  (this->tmp_str)._M_dataplus._M_p = (pointer)&(this->tmp_str).field_2;
  (this->tmp_str)._M_string_length = 0;
  (this->tmp_str).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Virtual_Machine::Virtual_Machine(RPN &prog_par, vector<ID_table_t>& ID_tables_vec_par):
    prog(prog_par),
    cmd_ptr(prog.cbegin()),
    ID_tables_vec(ID_tables_vec_par),
    c_lex(LEX_NULL),
    arg1(LEX_NULL),
    arg2(LEX_NULL){}